

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

HandlerCallInstr * __thiscall
flow::IRBuilder::
insert<flow::HandlerCallInstr,flow::IRBuiltinHandler*&,std::vector<flow::Value*,std::allocator<flow::Value*>>const&>
          (IRBuilder *this,IRBuiltinHandler **args,
          vector<flow::Value_*,_std::allocator<flow::Value_*>_> *args_1)

{
  Instr *pIVar1;
  unique_ptr<flow::HandlerCallInstr,_std::default_delete<flow::HandlerCallInstr>_> local_30;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_28;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *local_20;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *args_local_1;
  IRBuiltinHandler **args_local;
  IRBuilder *this_local;
  
  local_20 = args_1;
  args_local_1 = (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)args;
  args_local = (IRBuiltinHandler **)this;
  std::
  make_unique<flow::HandlerCallInstr,flow::IRBuiltinHandler*,std::vector<flow::Value*,std::allocator<flow::Value*>>const>
            ((IRBuiltinHandler **)&local_30,
             (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)args);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::HandlerCallInstr,std::default_delete<flow::HandlerCallInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_28,&local_30);
  pIVar1 = insert(this,&local_28);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_28);
  std::unique_ptr<flow::HandlerCallInstr,_std::default_delete<flow::HandlerCallInstr>_>::~unique_ptr
            (&local_30);
  return (HandlerCallInstr *)pIVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }